

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler_unittest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  char *pcVar3;
  
  if (argc < 2) {
    main_cold_1();
LAB_0010149d:
    iVar1 = 1;
  }
  else {
    g_iters = atoi(argv[1]);
    iVar1 = 1;
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
    }
    if (argc < 4) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = argv[3];
    }
    if (pcVar3 != (char *)0x0) {
      ProfilerStart();
    }
    test_main_thread();
    ProfilerFlush();
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        if (pcVar3 != (char *)0x0) {
          puts("FORK test only makes sense when no filename is specified.");
          return 2;
        }
        do {
          _Var2 = fork();
          if (_Var2 == -1) {
            puts("FORK failed!");
            goto LAB_0010149d;
          }
          if (_Var2 == 0) {
            iVar1 = execl(*argv,*argv,argv[1],0);
            return iVar1;
          }
          wait((void *)0x0);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0);
      }
    }
    else {
      RunManyThreads(test_other_thread,iVar1);
    }
    test_main_thread();
    iVar1 = 0;
    if (pcVar3 != (char *)0x0) {
      ProfilerStop();
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
  if ( argc <= 1 ) {
    fprintf(stderr, "USAGE: %s <iters> [num_threads] [filename]\n", argv[0]);
    fprintf(stderr, "   iters: How many million times to run the XOR test.\n");
    fprintf(stderr, "   num_threads: how many concurrent threads.\n");
    fprintf(stderr, "                0 or 1 for single-threaded mode,\n");
    fprintf(stderr, "                -# to fork instead of thread.\n");
    fprintf(stderr, "   filename: The name of the output profile.\n");
    fprintf(stderr, ("             If you don't specify, set CPUPROFILE "
                     "in the environment instead!\n"));
    return 1;
  }

  g_iters = atoi(argv[1]);
  int num_threads = 1;
  const char* filename = nullptr;
  if (argc > 2) {
    num_threads = atoi(argv[2]);
  }
  if (argc > 3) {
    filename = argv[3];
  }

  if (filename) {
    ProfilerStart(filename);
  }

  test_main_thread();

  ProfilerFlush();                           // just because we can

  // The other threads, if any, will run only half as long as the main thread
  if(num_threads > 0) {
    RunManyThreads(test_other_thread, num_threads);
  } else {
  // Or maybe they asked to fork.  The fork test is only interesting
  // when we use CPUPROFILE to name, so check for that
#ifdef HAVE_UNISTD_H
    for (; num_threads < 0; ++num_threads) {   // -<num_threads> to fork
      if (filename) {
        printf("FORK test only makes sense when no filename is specified.\n");
        return 2;
      }
      switch (fork()) {
        case -1:
          printf("FORK failed!\n");
          return 1;
        case 0:             // child
          return execl(argv[0], argv[0], argv[1], nullptr);
        default:
          wait(nullptr);       // we'll let the kids run one at a time
      }
    }
#else
    fprintf(stderr, "%s was compiled without support for fork() and exec()\n", argv[0]);
#endif
  }

  test_main_thread();

  if (filename) {
    ProfilerStop();
  }

  return 0;
}